

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O0

parser_error parse_summon_base(parser *p)

{
  void *pvVar1;
  undefined8 *p_00;
  char *name;
  monster_base *pmVar2;
  monster_base_list *b;
  monster_base *base;
  summon *s;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  p_00 = (undefined8 *)mem_zalloc(0x10);
  if (pvVar1 != (void *)0x0) {
    name = parser_getsym(p,"base");
    pmVar2 = lookup_monster_base(name);
    if (pmVar2 == (monster_base *)0x0) {
      mem_free(p_00);
      p_local._4_4_ = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      *p_00 = pmVar2;
      p_00[1] = *(undefined8 *)((long)pvVar1 + 0x18);
      *(undefined8 **)((long)pvVar1 + 0x18) = p_00;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-summon.c"
                ,0x67,"enum parser_error parse_summon_base(struct parser *)");
}

Assistant:

static enum parser_error parse_summon_base(struct parser *p) {
	struct summon *s = parser_priv(p);
	struct monster_base *base;
	struct monster_base_list *b = mem_zalloc(sizeof(*b));
	assert(s);
	base = lookup_monster_base(parser_getsym(p, "base"));
	if (base == NULL) {
		mem_free(b);
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	b->base = base;
	b->next = s->bases;
	s->bases = b;
	return PARSE_ERROR_NONE;
}